

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position_iterator.hpp
# Opt level: O0

void __thiscall
boost::spirit::classic::
position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>
::position_iterator<char_const*>
          (position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
           *this,file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
                 *begin,
          file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_> *end
          ,char *fileName)

{
  iterator_facade<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_const_char,_std::random_access_iterator_tag,_const_char_&,_long>
  iVar1;
  allocator<char> *this_00;
  iterator_facade<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_const_char,_std::random_access_iterator_tag,_const_char_&,_long>
  *lhs;
  allocator<char> *in_RDI;
  iterator_facade<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_const_char,_std::random_access_iterator_tag,_const_char_&,_long>
  *in_stack_ffffffffffffff68;
  iterator_adaptor<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_const_char,_boost::forward_traversal_tag,_boost::use_default,_boost::use_default>
  *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  iterator_adaptor<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_const_char,_boost::forward_traversal_tag,_boost::use_default,_boost::use_default>
  ::iterator_adaptor(in_stack_ffffffffffffff70,
                     (file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
                      *)in_stack_ffffffffffffff68);
  position_policy<boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::position_policy((position_policy<boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(in_RDI + 0x18));
  file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>::
  file_iterator(&in_stack_ffffffffffffff70->m_iterator,
                (file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>
                 *)in_stack_ffffffffffffff68);
  this_00 = in_RDI + 0x38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI);
  file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::file_position_base
            ((file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
  lhs = (iterator_facade<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_const_char,_std::random_access_iterator_tag,_const_char_&,_long>
         *)(in_RDI + 0x60);
  iVar1 = (iterator_facade<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_const_char,_std::random_access_iterator_tag,_const_char_&,_long>
           )boost::operator==(lhs,in_stack_ffffffffffffff68);
  *lhs = iVar1;
  return;
}

Assistant:

position_iterator(
        const ForwardIteratorT& begin,
        const ForwardIteratorT& end,
        FileNameT fileName)
    :   base_t(begin), _end(end), _pos(PositionT(fileName)),
        _isend(begin == end)
    {}